

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void rbuUnlockShm(rbu_file *p)

{
  _func_int_sqlite3_file_ptr_int_int_int *p_Var1;
  int local_1c;
  int i;
  _func_int_sqlite3_file_ptr_int_int_int *xShmLock;
  rbu_file *p_local;
  
  if (p->pRbu != (sqlite3rbu *)0x0) {
    p_Var1 = p->pReal->pMethods->xShmLock;
    for (local_1c = 0; local_1c < 8; local_1c = local_1c + 1) {
      if ((1 << ((byte)local_1c & 0x1f) & p->pRbu->mLock) != 0) {
        (*p_Var1)(p->pReal,local_1c,1,9);
      }
    }
    p->pRbu->mLock = 0;
  }
  return;
}

Assistant:

static void rbuUnlockShm(rbu_file *p){
  assert( p->openFlags & SQLITE_OPEN_MAIN_DB );
  if( p->pRbu ){
    int (*xShmLock)(sqlite3_file*,int,int,int) = p->pReal->pMethods->xShmLock;
    int i;
    for(i=0; i<SQLITE_SHM_NLOCK;i++){
      if( (1<<i) & p->pRbu->mLock ){
        xShmLock(p->pReal, i, 1, SQLITE_SHM_UNLOCK|SQLITE_SHM_EXCLUSIVE);
      }
    }
    p->pRbu->mLock = 0;
  }
}